

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_erl_generator.cc
# Opt level: O0

string * __thiscall
t_erl_generator::render_includes_abi_cxx11_(string *__return_storage_ptr__,t_erl_generator *this)

{
  vector<t_program_*,_std::allocator<t_program_*>_> *this_00;
  bool bVar1;
  reference pptVar2;
  string *psVar3;
  size_type sVar4;
  string local_d8;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  t_program *local_58;
  t_program *include;
  const_iterator __end1;
  const_iterator __begin1;
  vector<t_program_*,_std::allocator<t_program_*>_> *__range1;
  allocator local_22;
  undefined1 local_21;
  vector<t_program_*,_std::allocator<t_program_*>_> *local_20;
  vector<t_program_*,_std::allocator<t_program_*>_> *includes;
  t_erl_generator *this_local;
  string *result;
  
  includes = (vector<t_program_*,_std::allocator<t_program_*>_> *)this;
  this_local = (t_erl_generator *)__return_storage_ptr__;
  local_20 = t_program::get_includes((this->super_t_generator).program_);
  local_21 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_22);
  std::allocator<char>::~allocator((allocator<char> *)&local_22);
  this_00 = local_20;
  __end1 = std::vector<t_program_*,_std::allocator<t_program_*>_>::begin(local_20);
  include = (t_program *)std::vector<t_program_*,_std::allocator<t_program_*>_>::end(this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<t_program_*const_*,_std::vector<t_program_*,_std::allocator<t_program_*>_>_>
                                     *)&include), bVar1) {
    pptVar2 = __gnu_cxx::
              __normal_iterator<t_program_*const_*,_std::vector<t_program_*,_std::allocator<t_program_*>_>_>
              ::operator*(&__end1);
    local_58 = *pptVar2;
    psVar3 = t_program::get_name_abi_cxx11_(local_58);
    std::__cxx11::string::string((string *)&local_d8,(string *)psVar3);
    make_safe_for_module_name(&local_b8,this,&local_d8);
    std::operator+(&local_98,"-include(\"",&local_b8);
    std::operator+(&local_78,&local_98,"_types.hrl\").\n");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    __gnu_cxx::
    __normal_iterator<t_program_*const_*,_std::vector<t_program_*,_std::allocator<t_program_*>_>_>::
    operator++(&__end1);
  }
  sVar4 = std::vector<t_program_*,_std::allocator<t_program_*>_>::size(local_20);
  if (sVar4 != 0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\n");
  }
  return __return_storage_ptr__;
}

Assistant:

string t_erl_generator::render_includes() {
  const vector<t_program*>& includes = program_->get_includes();
  string result = "";
  for (auto include : includes) {
    result += "-include(\"" + make_safe_for_module_name(include->get_name())
              + "_types.hrl\").\n";
  }
  if (includes.size() > 0) {
    result += "\n";
  }
  return result;
}